

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

IRNode * __thiscall kratos::ConditionalExpr::get_child(ConditionalExpr *this,uint64_t index)

{
  uint64_t index_local;
  ConditionalExpr *this_local;
  
  if (index == 0) {
    this_local = (ConditionalExpr *)this->condition;
  }
  else if (index == 1) {
    this_local = (ConditionalExpr *)(this->super_Expr).left;
  }
  else if (index == 2) {
    this_local = (ConditionalExpr *)(this->super_Expr).right;
  }
  else {
    this_local = (ConditionalExpr *)0x0;
  }
  return (IRNode *)this_local;
}

Assistant:

IRNode *ConditionalExpr::get_child(uint64_t index) {
    if (index == 0)
        return condition;
    else if (index == 1)
        return left;
    else if (index == 2)
        return right;
    else
        return nullptr;
}